

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

TestCaseGroup * vkt::pipeline::createStencilTests(TestContext *testCtx)

{
  PtrData<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> data;
  bool bVar1;
  TestCaseGroup *pTVar2;
  char *name;
  char *pcVar3;
  ostream *poVar4;
  MovePtr *this;
  string *description;
  TestNode *pTVar5;
  StencilTest *pSVar6;
  TestNode *pTVar7;
  VkFormat format;
  deUint32 *in_stack_fffffffffffffac8;
  undefined8 in_stack_fffffffffffffad0;
  string local_3c8;
  string local_3a8;
  undefined1 local_381;
  string local_380;
  string local_360;
  undefined1 local_340 [8];
  VkStencilOpState stencilState;
  VkStencilOpState firstStencilState;
  VkStencilOpState prevStencilState;
  PtrData<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_2c8;
  PtrData<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *local_2b8;
  uint *local_2a8;
  StencilStateConfig *stencilConfig;
  ostringstream local_298 [4];
  int quadNdx;
  ostringstream desc;
  undefined1 local_120 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> stencilStateTests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTest;
  ulong uStack_90;
  VkFormat stencilFormat;
  size_t formatNdx;
  StencilOpStateUniqueRandomIterator stencilOpItr;
  undefined1 local_58 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTests;
  undefined1 local_38 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> stencilTests;
  VkFormat stencilFormats [4];
  TestContext *testCtx_local;
  
  stencilTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = 0x800000007f;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"stencil","Stencil tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &formatTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"format","Uses different stencil formats");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             ((long)&stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>.m_currentIndex +
             7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58,pTVar2
            );
  anon_unknown_0::StencilOpStateUniqueRandomIterator::StencilOpStateUniqueRandomIterator
            ((StencilOpStateUniqueRandomIterator *)&formatNdx,0x7b);
  for (uStack_90 = 0; uStack_90 < 4; uStack_90 = uStack_90 + 1) {
    formatTest.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _12_4_ = stencilFormats[uStack_90 - 2];
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    stencilStateTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data._14_1_ = 1;
    (anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_c8,
               (_anonymous_namespace_ *)
               (ulong)(uint)formatTest.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._12_4_,format);
    name = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Uses format ",
               (allocator<char> *)
               &stencilStateTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    pcVar3 = ::vk::getFormatName(formatTest.
                                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                 .m_data._12_4_);
    std::operator+(&local_e8,&local_108,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,name,pcVar3);
    stencilStateTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data._14_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)
               &stencilStateTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xd);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a8,
               pTVar2);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &stencilStateTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_c8);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_120);
    std::__cxx11::ostringstream::ostringstream(local_298);
    std::operator<<((ostream *)local_298,
                    "Draws 4 quads with the following depths and dynamic stencil states: ");
    for (stencilConfig._4_4_ = 0; stencilConfig._4_4_ < 4;
        stencilConfig._4_4_ = stencilConfig._4_4_ + 1) {
      local_2a8 = (uint *)((anonymous_namespace)::StencilTest::s_stencilStateConfigs +
                          (long)stencilConfig._4_4_ * 0x18);
      poVar4 = std::operator<<((ostream *)local_298,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,stencilConfig._4_4_);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"z = ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,*(float *)((anonymous_namespace)::StencilTest::s_quadDepths +
                                           (long)stencilConfig._4_4_ * 4));
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"frontReadMask = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_2a8);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"frontWriteMask = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a8[1]);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"frontRef = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a8[2]);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"backReadMask = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a8[3]);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"backWriteMask = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a8[4]);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"backRef = ");
      std::ostream::operator<<(poVar4,local_2a8[5]);
    }
    this = (MovePtr *)operator_new(0x70);
    prevStencilState.writeMask._3_1_ = 1;
    std::__cxx11::ostringstream::str();
    description = (string *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"states",(char *)description);
    prevStencilState.writeMask._3_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&prevStencilState.writeMask + 2));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&local_2c8);
    local_2b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2c8,this);
    data._8_8_ = in_stack_fffffffffffffad0;
    data.ptr = (TestCaseGroup *)in_stack_fffffffffffffac8;
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::operator=
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_120,
               data);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&local_2c8);
    std::__cxx11::string::~string((string *)&prevStencilState.reference);
    std::__cxx11::ostringstream::~ostringstream(local_298);
    UniqueRandomIterator<vk::VkStencilOpState>::reset
              ((UniqueRandomIterator<vk::VkStencilOpState> *)&formatNdx);
    UniqueRandomIterator<vk::VkStencilOpState>::next
              ((VkStencilOpState *)&firstStencilState.writeMask,
               (UniqueRandomIterator<vk::VkStencilOpState> *)&formatNdx);
    stencilState.writeMask = firstStencilState.writeMask;
    stencilState.reference = firstStencilState.reference;
    firstStencilState.failOp = prevStencilState.failOp;
    firstStencilState.passOp = prevStencilState.passOp;
    firstStencilState.depthFailOp = prevStencilState.depthFailOp;
    firstStencilState.compareOp = prevStencilState.compareOp;
    firstStencilState.compareMask = prevStencilState.compareMask;
    while( true ) {
      bVar1 = UniqueRandomIterator<vk::VkStencilOpState>::hasNext
                        ((UniqueRandomIterator<vk::VkStencilOpState> *)&formatNdx);
      if (!bVar1) break;
      UniqueRandomIterator<vk::VkStencilOpState>::next
                ((VkStencilOpState *)local_340,
                 (UniqueRandomIterator<vk::VkStencilOpState> *)&formatNdx);
      pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_120)->super_TestNode;
      pSVar6 = (StencilTest *)operator_new(0xb0);
      local_381 = 1;
      (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
                (&local_360,(_anonymous_namespace_ *)local_340,
                 (VkStencilOpState *)&firstStencilState.writeMask,(VkStencilOpState *)description);
      (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
                (&local_380,(_anonymous_namespace_ *)local_340,
                 (VkStencilOpState *)&firstStencilState.writeMask,(VkStencilOpState *)description);
      description = &local_380;
      anon_unknown_0::StencilTest::StencilTest
                (pSVar6,testCtx,&local_360,description,
                 formatTest.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._12_4_,(VkStencilOpState *)local_340,
                 (VkStencilOpState *)&firstStencilState.writeMask);
      local_381 = 0;
      tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      firstStencilState.writeMask = local_340._0_4_;
      firstStencilState.reference = local_340._4_4_;
      prevStencilState.failOp = stencilState.failOp;
      prevStencilState.passOp = stencilState.passOp;
      prevStencilState.depthFailOp = stencilState.depthFailOp;
      prevStencilState.compareOp = stencilState.compareOp;
      prevStencilState.compareMask = stencilState.compareMask;
    }
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_120)->super_TestNode;
    pSVar6 = (StencilTest *)operator_new(0xb0);
    (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
              (&local_3a8,(_anonymous_namespace_ *)&stencilState.writeMask,
               (VkStencilOpState *)&firstStencilState.writeMask,(VkStencilOpState *)description);
    (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
              (&local_3c8,(_anonymous_namespace_ *)&stencilState.writeMask,
               (VkStencilOpState *)&firstStencilState.writeMask,(VkStencilOpState *)description);
    in_stack_fffffffffffffac8 = &firstStencilState.writeMask;
    anon_unknown_0::StencilTest::StencilTest
              (pSVar6,testCtx,&local_3a8,&local_3c8,
               formatTest.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               _12_4_,(VkStencilOpState *)&stencilState.writeMask,
               (VkStencilOpState *)in_stack_fffffffffffffac8);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3a8);
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_a8)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_120)->super_TestNode;
    tcu::TestNode::addChild(pTVar5,pTVar7);
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_58)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_a8)->super_TestNode;
    tcu::TestNode::addChild(pTVar5,pTVar7);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_120);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a8);
  }
  pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_38)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38)
  ;
  anon_unknown_0::StencilOpStateUniqueRandomIterator::~StencilOpStateUniqueRandomIterator
            ((StencilOpStateUniqueRandomIterator *)&formatNdx);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createStencilTests (tcu::TestContext& testCtx)
{
	const VkFormat stencilFormats[] =
	{
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT
	};

	de::MovePtr<tcu::TestCaseGroup>		stencilTests	(new tcu::TestCaseGroup(testCtx, "stencil", "Stencil tests"));
	de::MovePtr<tcu::TestCaseGroup>		formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses different stencil formats"));
	StencilOpStateUniqueRandomIterator	stencilOpItr	(123);

	for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(stencilFormats); formatNdx++)
	{
		const VkFormat					stencilFormat	= stencilFormats[formatNdx];
		de::MovePtr<tcu::TestCaseGroup>	formatTest		(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(stencilFormat).c_str(),
																				(std::string("Uses format ") + getFormatName(stencilFormat)).c_str()));

		de::MovePtr<tcu::TestCaseGroup>	stencilStateTests;
		{
			std::ostringstream desc;
			desc << "Draws 4 quads with the following depths and dynamic stencil states: ";
			for (int quadNdx = 0; quadNdx < StencilTest::QUAD_COUNT; quadNdx++)
			{
				const StencilTest::StencilStateConfig& stencilConfig = StencilTest::s_stencilStateConfigs[quadNdx];

				desc << "(" << quadNdx << ") "
					 << "z = " << StencilTest::s_quadDepths[quadNdx] << ", "
					 << "frontReadMask = " << stencilConfig.frontReadMask << ", "
					 << "frontWriteMask = " << stencilConfig.frontWriteMask << ", "
					 << "frontRef = " << stencilConfig.frontRef << ", "
					 << "backReadMask = " << stencilConfig.backReadMask << ", "
					 << "backWriteMask = " << stencilConfig.backWriteMask << ", "
					 << "backRef = " << stencilConfig.backRef;
			}

			stencilStateTests = de::MovePtr<tcu::TestCaseGroup>(new tcu::TestCaseGroup(testCtx, "states", desc.str().c_str()));
		}

		stencilOpItr.reset();

		VkStencilOpState		prevStencilState	= stencilOpItr.next();
		const VkStencilOpState	firstStencilState	= prevStencilState;

		while (stencilOpItr.hasNext())
		{
			const VkStencilOpState stencilState = stencilOpItr.next();

			// Use current stencil state in front fraces and previous state in back faces
			stencilStateTests->addChild(new StencilTest(testCtx,
														getStencilStateSetName(stencilState, prevStencilState),
														getStencilStateSetDescription(stencilState, prevStencilState),
														stencilFormat,
														stencilState,
														prevStencilState));

			prevStencilState = stencilState;
		}

		// Use first stencil state with last stencil state. This would make the test suite cover all states in front and back faces.
		stencilStateTests->addChild(new StencilTest(testCtx,
													getStencilStateSetName(firstStencilState, prevStencilState),
													getStencilStateSetDescription(firstStencilState, prevStencilState),
													stencilFormat,
													firstStencilState,
													prevStencilState));

		formatTest->addChild(stencilStateTests.release());
		formatTests->addChild(formatTest.release());
	}
	stencilTests->addChild(formatTests.release());

	return stencilTests.release();
}